

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

shared_ptr<chrono::ChLinkTSDA> __thiscall
chrono::viper::AddSuspensionSpring
          (viper *this,shared_ptr<chrono::ChBodyAuxRef> *body1,
          shared_ptr<chrono::ChBodyAuxRef> *body2,shared_ptr<chrono::viper::ViperChassis> *chassis,
          ChVector<double> *pos1,ChVector<double> *pos2)

{
  element_type *peVar1;
  ChFrame<double> *this_00;
  element_type *peVar2;
  ChSystem *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkTSDA> sVar4;
  shared_ptr<chrono::ChLinkBase> local_118;
  undefined1 local_108 [40];
  ChVector<double> local_e0;
  shared_ptr<chrono::ChBody> local_c8;
  shared_ptr<chrono::ChBody> local_b8;
  shared_ptr<chrono::ChLinkTSDA> local_a8;
  undefined1 local_91;
  undefined1 local_90 [8];
  ChVector<double> p2;
  ChVector<double> p1;
  undefined1 local_50 [24];
  ChFrame<double> *X_GP;
  ChVector<double> *pos2_local;
  ChVector<double> *pos1_local;
  shared_ptr<chrono::viper::ViperChassis> *chassis_local;
  shared_ptr<chrono::ChBodyAuxRef> *body2_local;
  shared_ptr<chrono::ChBodyAuxRef> *body1_local;
  shared_ptr<chrono::ChLinkTSDA> *spring;
  
  X_GP = (ChFrame<double> *)pos2;
  pos2_local = pos1;
  pos1_local = (ChVector<double> *)chassis;
  chassis_local = (shared_ptr<chrono::viper::ViperChassis> *)body2;
  body2_local = body1;
  body1_local = (shared_ptr<chrono::ChBodyAuxRef> *)this;
  std::__shared_ptr_access<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)chassis);
  ViperPart::GetBody((ViperPart *)local_50);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  this_00 = (ChFrame<double> *)(**(code **)(*(long *)peVar1 + 0x1f0))();
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_50);
  local_50._16_8_ = this_00;
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)(p2.m_data + 2),this_00,pos2_local);
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)local_90,(ChFrame<double> *)local_50._16_8_,
             (ChVector<double> *)X_GP);
  local_91 = 0;
  std::shared_ptr<chrono::ChLinkTSDA>::shared_ptr((shared_ptr<chrono::ChLinkTSDA> *)this);
  chrono_types::make_shared<chrono::ChLinkTSDA,_0>();
  std::shared_ptr<chrono::ChLinkTSDA>::operator=((shared_ptr<chrono::ChLinkTSDA> *)this,&local_a8);
  std::shared_ptr<chrono::ChLinkTSDA>::~shared_ptr(&local_a8);
  peVar2 = std::__shared_ptr_access<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_b8,body1);
  std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>(&local_c8,body2);
  ChVector<double>::ChVector(&local_e0,(ChVector<double> *)(p2.m_data + 2));
  ChVector<double>::ChVector((ChVector<double> *)(local_108 + 0x10),(ChVector<double> *)local_90);
  chrono::ChLinkTSDA::Initialize(peVar2,&local_b8,&local_c8,0,&local_e0,local_108 + 0x10);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_c8);
  std::shared_ptr<chrono::ChBody>::~shared_ptr(&local_b8);
  peVar2 = std::__shared_ptr_access<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ChLinkTSDA::SetSpringCoefficient(peVar2,800000.0);
  peVar2 = std::__shared_ptr_access<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ChLinkTSDA::SetDampingCoefficient(peVar2,10000.0);
  std::__shared_ptr_access<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)chassis);
  ViperPart::GetBody((ViperPart *)local_108);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_108);
  pCVar3 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar1);
  std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkTSDA,void>
            (&local_118,(shared_ptr<chrono::ChLinkTSDA> *)this);
  (**(code **)(*(long *)pCVar3 + 0x138))(pCVar3,&local_118);
  std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_118);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_108);
  sVar4.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkTSDA>)
         sVar4.super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkTSDA> AddSuspensionSpring(std::shared_ptr<ChBodyAuxRef> body1,
                                                std::shared_ptr<ChBodyAuxRef> body2,
                                                std::shared_ptr<ViperChassis> chassis,
                                                const ChVector<>& pos1,
                                                const ChVector<>& pos2) {
    const ChFrame<>& X_GP = chassis->GetBody()->GetFrame_REF_to_abs();
    auto p1 = X_GP.TransformPointLocalToParent(pos1);
    auto p2 = X_GP.TransformPointLocalToParent(pos2);

    std::shared_ptr<ChLinkTSDA> spring;
    spring = chrono_types::make_shared<ChLinkTSDA>();
    spring->Initialize(body1, body2, false, p1, p2);
    spring->SetSpringCoefficient(800000.0);
    spring->SetDampingCoefficient(10000.0);
    chassis->GetBody()->GetSystem()->AddLink(spring);
    return spring;
}